

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trade.cpp
# Opt level: O0

void Handlers::Trade_Add(Character *character,PacketReader *reader)

{
  Character_Item CVar1;
  bool bVar2;
  bool bVar3;
  unsigned_short item_00;
  uint amount_00;
  int iVar4;
  EIF_Data *pEVar5;
  size_type sVar6;
  size_type sVar7;
  list<Character_Item,_std::allocator<Character_Item>_> *this;
  reference pCVar8;
  short local_c8;
  int iStack_c4;
  Character_Item item_2;
  iterator __end2_1;
  iterator __begin2_1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2_1;
  Character_Item item_1;
  iterator __end2;
  iterator __begin2;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2;
  undefined1 local_78 [8];
  PacketBuilder builder;
  Character_Item item;
  iterator __end1;
  iterator __begin1;
  list<Character_Item,_std::allocator<Character_Item>_> *__range1;
  bool offered;
  int amount;
  int itemid;
  PacketReader *reader_local;
  Character *character_local;
  
  if ((character->trading & 1U) != 0) {
    item_00 = PacketReader::GetShort(reader);
    amount_00 = PacketReader::GetInt(reader);
    pEVar5 = EIF::Get(character->world->eif,(uint)item_00);
    if (pEVar5->special != Lore) {
      bVar3 = false;
      __end1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                         (&character->trade_inventory);
      item = (Character_Item)
             std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                       (&character->trade_inventory);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&item), bVar2) {
        pCVar8 = std::_List_iterator<Character_Item>::operator*(&__end1);
        builder.add_size = *(size_t *)pCVar8;
        if ((int)(short)builder.add_size == (uint)item_00) {
          bVar3 = true;
          break;
        }
        std::_List_iterator<Character_Item>::operator++(&__end1);
      }
      if (((bVar3) ||
          (sVar6 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                             (&character->trade_inventory), sVar6 < 10)) &&
         (bVar3 = Character::AddTradeItem(character,item_00,amount_00), bVar3)) {
        character->trade_agree = false;
        character->trade_partner->trade_agree = false;
        sVar6 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                          (&character->trade_inventory);
        sVar7 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                          (&character->trade_partner->trade_inventory);
        PacketBuilder::PacketBuilder
                  ((PacketBuilder *)local_78,PACKET_TRADE,PACKET_REPLY,sVar7 * 6 + 6 + sVar6 * 6);
        iVar4 = Character::PlayerID(character);
        PacketBuilder::AddShort((PacketBuilder *)local_78,iVar4);
        __end2 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin
                           (&character->trade_inventory);
        item_1 = (Character_Item)
                 std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end
                           (&character->trade_inventory);
        while (bVar3 = std::operator!=(&__end2,(_Self *)&item_1), bVar3) {
          pCVar8 = std::_List_iterator<Character_Item>::operator*(&__end2);
          CVar1 = *pCVar8;
          __range2_1._0_2_ = CVar1.id;
          PacketBuilder::AddShort((PacketBuilder *)local_78,(int)(short)__range2_1);
          __range2_1._4_4_ = CVar1.amount;
          PacketBuilder::AddInt((PacketBuilder *)local_78,__range2_1._4_4_);
          std::_List_iterator<Character_Item>::operator++(&__end2);
        }
        PacketBuilder::AddByte((PacketBuilder *)local_78,0xff);
        iVar4 = Character::PlayerID(character->trade_partner);
        PacketBuilder::AddShort((PacketBuilder *)local_78,iVar4);
        this = &character->trade_partner->trade_inventory;
        __end2_1 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(this);
        item_2 = (Character_Item)
                 std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(this);
        while (bVar3 = std::operator!=(&__end2_1,(_Self *)&item_2), bVar3) {
          pCVar8 = std::_List_iterator<Character_Item>::operator*(&__end2_1);
          CVar1 = *pCVar8;
          local_c8 = CVar1.id;
          PacketBuilder::AddShort((PacketBuilder *)local_78,(int)local_c8);
          iStack_c4 = CVar1.amount;
          PacketBuilder::AddInt((PacketBuilder *)local_78,iStack_c4);
          std::_List_iterator<Character_Item>::operator++(&__end2_1);
        }
        PacketBuilder::AddByte((PacketBuilder *)local_78,0xff);
        Character::Send(character,(PacketBuilder *)local_78);
        Character::Send(character->trade_partner,(PacketBuilder *)local_78);
        PacketBuilder::~PacketBuilder((PacketBuilder *)local_78);
      }
    }
  }
  return;
}

Assistant:

void Trade_Add(Character *character, PacketReader &reader)
{
	if (!character->trading) return;

	int itemid = reader.GetShort();
	int amount = reader.GetInt();

	if (character->world->eif->Get(itemid).special == EIF::Lore)
	{
		return;
	}

	bool offered = false;
	UTIL_FOREACH(character->trade_inventory, item)
	{
		if (item.id == itemid)
		{
			offered = true;
			break;
		}
	}

	if (!offered && character->trade_inventory.size() >= 10)
	{
		return;
	}

	if (character->AddTradeItem(itemid, amount))
	{
		character->trade_agree = false;
		character->trade_partner->trade_agree = false;

		PacketBuilder builder(PACKET_TRADE, PACKET_REPLY,
			6 + character->trade_inventory.size() * 6 + character->trade_partner->trade_inventory.size() * 6);

		builder.AddShort(character->PlayerID());
		UTIL_FOREACH(character->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		builder.AddShort(character->trade_partner->PlayerID());
		UTIL_FOREACH(character->trade_partner->trade_inventory, item)
		{
			builder.AddShort(item.id);
			builder.AddInt(item.amount);
		}
		builder.AddByte(255);

		character->Send(builder);
		character->trade_partner->Send(builder);
	}
}